

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int json_next_token(JSParseState *s)

{
  JSToken *token;
  size_t sVar1;
  char cVar2;
  JSRuntime *pJVar3;
  uint uVar4;
  int iVar5;
  JSAtom JVar6;
  ulong len;
  uintptr_t sp;
  byte *pbVar7;
  char *pcVar8;
  byte bVar9;
  char *pcVar10;
  bool bVar11;
  JSValue JVar12;
  byte local_d8 [8];
  char ident_buf [128];
  size_t local_48;
  byte *local_40;
  char *buf;
  
  if (&stack0xfffffffffffffff8 < (undefined1 *)s->ctx->rt->stack_limit) {
    js_parse_error(s,"stack overflow");
    return -1;
  }
  token = &s->token;
  free_token(s,token);
  buf = (char *)s->buf_ptr;
  s->last_ptr = (uint8_t *)buf;
  s->last_line_num = (s->token).line_num;
LAB_0012c231:
  pcVar8 = buf;
  iVar5 = s->line_num;
  (s->token).line_num = iVar5;
  (s->token).ptr = (uint8_t *)buf;
  local_d8[0] = *buf;
  switch(local_d8[0]) {
  case 0:
    goto switchD_0012c250_caseD_0;
  default:
    if (-1 < (char)local_d8[0]) goto LAB_0012c572;
    pcVar8 = "unexpected character";
LAB_0012c48d:
    js_parse_error(s,pcVar8);
    goto LAB_0012c539;
  case 9:
  case 0x20:
    goto switchD_0012c250_caseD_9;
  case 10:
    goto switchD_0012c250_caseD_a;
  case 0xb:
  case 0xc:
    if (s->ext_json == 0) goto LAB_0012c572;
switchD_0012c250_caseD_9:
    buf = buf + 1;
    goto LAB_0012c231;
  case 0xd:
    if (buf[1] == '\n') {
      buf = buf + 1;
    }
switchD_0012c250_caseD_a:
    buf = buf + 1;
    s->line_num = iVar5 + 1;
    goto LAB_0012c231;
  case 0x22:
    iVar5 = 0x22;
    goto LAB_0012c4b1;
  case 0x24:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    pcVar10 = buf + 1;
    pbVar7 = local_d8;
    local_48 = 0x80;
    bVar9 = buf[1];
    buf = pcVar10;
    local_40 = pbVar7;
    if (-1 < (char)bVar9) {
      pbVar7 = local_d8;
      len = 1;
      goto LAB_0012c3b7;
    }
    len = 1;
    goto LAB_0012c438;
  case 0x27:
    iVar5 = 0x27;
    if (s->ext_json == 0) goto LAB_0012c572;
LAB_0012c4b1:
    iVar5 = js_parse_string(s,iVar5,1,(uint8_t *)(buf + 1),token,(uint8_t **)&buf);
    if (iVar5 != 0) goto LAB_0012c539;
    goto LAB_0012c477;
  case 0x2b:
    if (s->ext_json != 0) goto switchD_0012c250_caseD_2d;
    goto LAB_0012c572;
  case 0x2d:
switchD_0012c250_caseD_2d:
    if ((byte)buf[1] - 0x3a < 0xfffffff6) goto LAB_0012c572;
    break;
  case 0x2f:
    goto switchD_0012c250_caseD_2f;
  case 0x30:
    if (0xfffffff5 < (byte)buf[1] - 0x3a) goto LAB_0012c572;
    break;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    break;
  }
  bVar11 = s->ext_json != 0;
  iVar5 = 10;
  if (bVar11) {
    iVar5 = 0;
  }
  JVar12 = js_atof(s->ctx,buf,&buf,iVar5,(uint)bVar11 << 2);
  if ((int)JVar12.tag == 6) goto LAB_0012c539;
  (s->token).val = -0x80;
  (s->token).u.str.str = JVar12;
  goto LAB_0012c477;
switchD_0012c250_caseD_2f:
  if (s->ext_json != 0) {
    if (buf[1] == '/') {
      buf = buf + 2;
LAB_0012c308:
      cVar2 = *buf;
      if (cVar2 == '\0') {
        if (buf < s->buf_end) goto LAB_0012c35c;
      }
      else if ((cVar2 != '\n') && (cVar2 != '\r')) {
        if (-1 < cVar2) goto LAB_0012c35c;
        uVar4 = unicode_from_utf8((uint8_t *)buf,6,(uint8_t **)&buf);
        if ((uVar4 & 0xfffffffe) != 0x2028) goto code_r0x0012c34b;
      }
      goto LAB_0012c231;
    }
    if (buf[1] == '*') {
      buf = buf + 2;
LAB_0012c2a5:
      bVar9 = *buf;
      if (bVar9 < 0xd) {
        if (bVar9 == 0) {
          if (buf < s->buf_end) goto LAB_0012c2fb;
          pcVar8 = "unexpected end of comment";
          goto LAB_0012c48d;
        }
        if (bVar9 == 10) {
          s->line_num = s->line_num + 1;
          goto LAB_0012c2fb;
        }
LAB_0012c2c5:
        if (((char)bVar9 < '\0') &&
           (iVar5 = unicode_from_utf8((uint8_t *)buf,6,(uint8_t **)&buf), iVar5 != -1))
        goto LAB_0012c2a5;
      }
      else {
        if (bVar9 == 0xd) goto LAB_0012c2fb;
        if (bVar9 != 0x2a) goto LAB_0012c2c5;
        if (buf[1] == '/') goto LAB_0012c361;
      }
LAB_0012c2fb:
      buf = buf + 1;
      goto LAB_0012c2a5;
    }
  }
  goto LAB_0012c572;
code_r0x0012c34b:
  if (uVar4 == 0xffffffff) {
LAB_0012c35c:
    buf = buf + 1;
  }
  goto LAB_0012c308;
LAB_0012c361:
  buf = buf + 2;
  goto LAB_0012c231;
switchD_0012c250_caseD_0:
  if (buf < s->buf_end) {
LAB_0012c572:
    token->val = (uint)local_d8[0];
    buf = buf + 1;
  }
  else {
    token->val = -0x56;
  }
  goto LAB_0012c477;
  while( true ) {
    sVar1 = len + 1;
    pbVar7[len] = bVar9;
    bVar9 = pcVar8[len + 1];
    len = sVar1;
    if ((char)bVar9 < '\0') break;
LAB_0012c3b7:
    if ((*(uint *)((long)lre_id_continue_table_ascii + (ulong)(bVar9 >> 3 & 0x1c)) >> (bVar9 & 0x1f)
        & 1) == 0) {
      pcVar10 = pcVar8 + len;
      goto LAB_0012c438;
    }
    if ((local_48 - 6 <= len) &&
       (iVar5 = ident_realloc(s->ctx,(char **)&local_40,&local_48,(char *)local_d8),
       pbVar7 = local_40, iVar5 != 0)) {
      pcVar10 = pcVar8 + len + 1;
      JVar6 = 0;
      goto LAB_0012c443;
    }
  }
  pcVar10 = pcVar8 + sVar1;
LAB_0012c438:
  JVar6 = JS_NewAtomLen(s->ctx,(char *)pbVar7,len);
LAB_0012c443:
  if (local_40 != local_d8) {
    pJVar3 = s->ctx->rt;
    (*(pJVar3->mf).js_free)(&pJVar3->malloc_state,local_40);
  }
  if (JVar6 == 0) {
LAB_0012c539:
    token->val = -0x58;
    return -1;
  }
  (s->token).u.ident.atom = JVar6;
  *(undefined8 *)((long)&(s->token).u.str.str.u + 4) = 0;
  (s->token).val = -0x7d;
  buf = pcVar10;
LAB_0012c477:
  s->buf_ptr = (uint8_t *)buf;
  return 0;
}

Assistant:

static __exception int json_next_token(JSParseState *s)
{
    const uint8_t *p;
    int c;
    JSAtom atom;
    
    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        return js_parse_error(s, "stack overflow");
    }
    
    free_token(s, &s->token);

    p = s->last_ptr = s->buf_ptr;
    s->last_line_num = s->token.line_num;
 redo:
    s->token.line_num = s->line_num;
    s->token.ptr = p;
    c = *p;
    switch(c) {
    case 0:
        if (p >= s->buf_end) {
            s->token.val = TOK_EOF;
        } else {
            goto def_token;
        }
        break;
    case '\'':
        if (!s->ext_json) {
            /* JSON does not accept single quoted strings */
            goto def_token;
        }
        /* fall through */
    case '\"':
        if (js_parse_string(s, c, TRUE, p + 1, &s->token, &p))
            goto fail;
        break;
    case '\r':  /* accept DOS and MAC newline sequences */
        if (p[1] == '\n') {
            p++;
        }
        /* fall thru */
    case '\n':
        p++;
        s->line_num++;
        goto redo;
    case '\f':
    case '\v':
        if (!s->ext_json) {
            /* JSONWhitespace does not match <VT>, nor <FF> */
            goto def_token;
        }
        /* fall through */
    case ' ':
    case '\t':
        p++;
        goto redo;
    case '/':
        if (!s->ext_json) {
            /* JSON does not accept comments */
            goto def_token;
        }
        if (p[1] == '*') {
            /* comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end) {
                    js_parse_error(s, "unexpected end of comment");
                    goto fail;
                }
                if (p[0] == '*' && p[1] == '/') {
                    p += 2;
                    break;
                }
                if (*p == '\n') {
                    s->line_num++;
                    p++;
                } else if (*p == '\r') {
                    p++;
                } else if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else if (p[1] == '/') {
            /* line comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end)
                    break;
                if (*p == '\r' || *p == '\n')
                    break;
                if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    /* LS or PS are considered as line terminator */
                    if (c == CP_LS || c == CP_PS) {
                        break;
                    } else if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else {
            goto def_token;
        }
        break;
    case 'a': case 'b': case 'c': case 'd':
    case 'e': case 'f': case 'g': case 'h':
    case 'i': case 'j': case 'k': case 'l':
    case 'm': case 'n': case 'o': case 'p':
    case 'q': case 'r': case 's': case 't':
    case 'u': case 'v': case 'w': case 'x':
    case 'y': case 'z': 
    case 'A': case 'B': case 'C': case 'D':
    case 'E': case 'F': case 'G': case 'H':
    case 'I': case 'J': case 'K': case 'L':
    case 'M': case 'N': case 'O': case 'P':
    case 'Q': case 'R': case 'S': case 'T':
    case 'U': case 'V': case 'W': case 'X':
    case 'Y': case 'Z': 
    case '_':
    case '$':
        /* identifier : only pure ascii characters are accepted */
        p++;
        atom = json_parse_ident(s, &p, c);
        if (atom == JS_ATOM_NULL)
            goto fail;
        s->token.u.ident.atom = atom;
        s->token.u.ident.has_escape = FALSE;
        s->token.u.ident.is_reserved = FALSE;
        s->token.val = TOK_IDENT;
        break;
    case '+':
        if (!s->ext_json || !is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '0':
        if (is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '-':
        if (!is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8':
    case '9': 
        /* number */
    parse_number:
        {
            JSValue ret;
            int flags, radix;
            if (!s->ext_json) {
                flags = 0;
                radix = 10;
            } else {
                flags = ATOD_ACCEPT_BIN_OCT;
                radix = 0;
            }
            ret = js_atof(s->ctx, (const char *)p, (const char **)&p, radix,
                          flags);
            if (JS_IsException(ret))
                goto fail;
            s->token.val = TOK_NUMBER;
            s->token.u.num.val = ret;
        }
        break;
    default:
        if (c >= 128) {
            js_parse_error(s, "unexpected character");
            goto fail;
        }
    def_token:
        s->token.val = c;
        p++;
        break;
    }
    s->buf_ptr = p;

    //    dump_token(s, &s->token);
    return 0;

 fail:
    s->token.val = TOK_ERROR;
    return -1;
}